

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculationengine.cpp
# Opt level: O0

void __thiscall CalculationEngine::CalculationEngine(CalculationEngine *this,ostream *os)

{
  FloatType *this_00;
  IntegerType *this_01;
  ComplexType *this_02;
  pair<std::__detail::_Node_iterator<std::pair<const_ResultValueType,_std::unique_ptr<NumberType,_std::default_delete<NumberType>_>_>,_false,_true>,_bool>
  pVar1;
  unique_ptr<ComplexType,_std::default_delete<ComplexType>_> local_78;
  ResultValueType local_6c;
  _Node_iterator_base<std::pair<const_ResultValueType,_std::unique_ptr<NumberType,_std::default_delete<NumberType>_>_>,_true>
  local_68;
  undefined1 local_60;
  unique_ptr<IntegerType,_std::default_delete<IntegerType>_> local_58;
  ResultValueType local_4c;
  _Node_iterator_base<std::pair<const_ResultValueType,_std::unique_ptr<NumberType,_std::default_delete<NumberType>_>_>,_true>
  local_48;
  undefined1 local_40;
  unique_ptr<FloatType,_std::default_delete<FloatType>_> local_28;
  ResultValueType local_1c;
  ostream *local_18;
  ostream *os_local;
  CalculationEngine *this_local;
  
  this->mEvalMode = FLOAT;
  local_18 = os;
  os_local = (ostream *)this;
  std::
  unordered_map<ResultValueType,_std::unique_ptr<NumberType,_std::default_delete<NumberType>_>,_std::hash<ResultValueType>,_std::equal_to<ResultValueType>,_std::allocator<std::pair<const_ResultValueType,_std::unique_ptr<NumberType,_std::default_delete<NumberType>_>_>_>_>
  ::unordered_map(&this->mNumberTypes);
  local_1c = FLOAT;
  this_00 = (FloatType *)operator_new(0xe8);
  FloatType::FloatType(this_00);
  std::unique_ptr<FloatType,std::default_delete<FloatType>>::
  unique_ptr<std::default_delete<FloatType>,void>
            ((unique_ptr<FloatType,std::default_delete<FloatType>> *)&local_28,this_00);
  pVar1 = std::
          unordered_map<ResultValueType,std::unique_ptr<NumberType,std::default_delete<NumberType>>,std::hash<ResultValueType>,std::equal_to<ResultValueType>,std::allocator<std::pair<ResultValueType_const,std::unique_ptr<NumberType,std::default_delete<NumberType>>>>>
          ::emplace<ResultValueType,std::unique_ptr<FloatType,std::default_delete<FloatType>>>
                    ((unordered_map<ResultValueType,std::unique_ptr<NumberType,std::default_delete<NumberType>>,std::hash<ResultValueType>,std::equal_to<ResultValueType>,std::allocator<std::pair<ResultValueType_const,std::unique_ptr<NumberType,std::default_delete<NumberType>>>>>
                      *)&this->mNumberTypes,&local_1c,&local_28);
  local_48._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_ResultValueType,_std::unique_ptr<NumberType,_std::default_delete<NumberType>_>_>,_true>
       ._M_cur;
  local_40 = pVar1.second;
  std::unique_ptr<FloatType,_std::default_delete<FloatType>_>::~unique_ptr(&local_28);
  local_4c = INTEGER;
  this_01 = (IntegerType *)operator_new(0xe8);
  IntegerType::IntegerType(this_01,local_18);
  std::unique_ptr<IntegerType,std::default_delete<IntegerType>>::
  unique_ptr<std::default_delete<IntegerType>,void>
            ((unique_ptr<IntegerType,std::default_delete<IntegerType>> *)&local_58,this_01);
  pVar1 = std::
          unordered_map<ResultValueType,std::unique_ptr<NumberType,std::default_delete<NumberType>>,std::hash<ResultValueType>,std::equal_to<ResultValueType>,std::allocator<std::pair<ResultValueType_const,std::unique_ptr<NumberType,std::default_delete<NumberType>>>>>
          ::emplace<ResultValueType,std::unique_ptr<IntegerType,std::default_delete<IntegerType>>>
                    ((unordered_map<ResultValueType,std::unique_ptr<NumberType,std::default_delete<NumberType>>,std::hash<ResultValueType>,std::equal_to<ResultValueType>,std::allocator<std::pair<ResultValueType_const,std::unique_ptr<NumberType,std::default_delete<NumberType>>>>>
                      *)&this->mNumberTypes,&local_4c,&local_58);
  local_68._M_cur =
       (__node_type *)
       pVar1.first.
       super__Node_iterator_base<std::pair<const_ResultValueType,_std::unique_ptr<NumberType,_std::default_delete<NumberType>_>_>,_true>
       ._M_cur;
  local_60 = pVar1.second;
  std::unique_ptr<IntegerType,_std::default_delete<IntegerType>_>::~unique_ptr(&local_58);
  local_6c = COMPLEX;
  this_02 = (ComplexType *)operator_new(0xe8);
  ComplexType::ComplexType(this_02,local_18);
  std::unique_ptr<ComplexType,std::default_delete<ComplexType>>::
  unique_ptr<std::default_delete<ComplexType>,void>
            ((unique_ptr<ComplexType,std::default_delete<ComplexType>> *)&local_78,this_02);
  std::
  unordered_map<ResultValueType,std::unique_ptr<NumberType,std::default_delete<NumberType>>,std::hash<ResultValueType>,std::equal_to<ResultValueType>,std::allocator<std::pair<ResultValueType_const,std::unique_ptr<NumberType,std::default_delete<NumberType>>>>>
  ::emplace<ResultValueType,std::unique_ptr<ComplexType,std::default_delete<ComplexType>>>
            ((unordered_map<ResultValueType,std::unique_ptr<NumberType,std::default_delete<NumberType>>,std::hash<ResultValueType>,std::equal_to<ResultValueType>,std::allocator<std::pair<ResultValueType_const,std::unique_ptr<NumberType,std::default_delete<NumberType>>>>>
              *)&this->mNumberTypes,&local_6c,&local_78);
  std::unique_ptr<ComplexType,_std::default_delete<ComplexType>_>::~unique_ptr(&local_78);
  return;
}

Assistant:

CalculationEngine::CalculationEngine(std::ostream& os)
	: mEvalMode(ResultValueType::FLOAT) {
	mNumberTypes.emplace(ResultValueType::FLOAT, std::unique_ptr<FloatType>(new FloatType));
	mNumberTypes.emplace(ResultValueType::INTEGER, std::unique_ptr<IntegerType>(new IntegerType(os)));
	mNumberTypes.emplace(ResultValueType::COMPLEX, std::unique_ptr<ComplexType>(new ComplexType(os)));
}